

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void get_type_alias_name(c2m_ctx_t c2m_ctx,type *type,VARR_char *name)

{
  gen_ctx_conflict *pgVar1;
  long lVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  char cVar5;
  node_t_conflict pnVar6;
  decl_spec *pdVar7;
  decl_spec *ds;
  node_t_conflict p;
  mir_ullong v;
  expr_conflict *expr;
  node_t_conflict width;
  decl_t decl;
  node_t_conflict member;
  size_t i;
  basic_type basic_type;
  gen_ctx_t_conflict gen_ctx;
  VARR_char *name_local;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  switch(type->mode) {
  case TM_BASIC:
    i._4_4_ = (type->u).basic_type;
    goto LAB_001c027a;
  case TM_ENUM:
    i._4_4_ = get_enum_basic_type(type);
LAB_001c027a:
    switch(i._4_4_) {
    case TP_VOID:
      VARR_charpush(name,'v');
      break;
    case TP_BOOL:
      VARR_charpush(name,'b');
      break;
    case TP_CHAR:
    case TP_SCHAR:
    case TP_UCHAR:
      VARR_charpush(name,'c');
      break;
    case TP_SHORT:
    case TP_USHORT:
      VARR_charpush(name,'s');
      break;
    case TP_INT:
    case TP_UINT:
      VARR_charpush(name,'i');
      break;
    case TP_LONG:
    case TP_ULONG:
      VARR_charpush(name,'l');
      break;
    case TP_LLONG:
    case TP_ULLONG:
      VARR_charpush(name,'L');
      break;
    case TP_FLOAT:
      VARR_charpush(name,'f');
      break;
    case TP_DOUBLE:
      VARR_charpush(name,'d');
      break;
    case TP_LDOUBLE:
      VARR_charpush(name,'D');
      break;
    default:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2874,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
    }
    break;
  case TM_PTR:
    VARR_charpush(name,'p');
    get_type_alias_name(c2m_ctx,(type->u).ptr_type,name);
    break;
  case TM_STRUCT:
  case TM_UNION:
    cVar5 = 'U';
    if (type->mode == TM_STRUCT) {
      cVar5 = 'S';
    }
    VARR_charpush(name,cVar5);
    member = (node_t_conflict)0x0;
    while ((pnVar6 = (node_t_conflict)VARR_node_tlength(pgVar1->node_stack), member < pnVar6 &&
           (pnVar6 = VARR_node_tget(pgVar1->node_stack,(size_t)member), pnVar6 != (type->u).tag_type
           ))) {
      member = (node_t_conflict)((long)&member->code + 1);
    }
    pnVar6 = (node_t_conflict)VARR_node_tlength(pgVar1->node_stack);
    if (member < pnVar6) {
      VARR_charpush(name,'r');
      push_val(name,(mir_long)member);
    }
    else {
      VARR_node_tpush(pgVar1->node_stack,(type->u).tag_type);
      pnVar6 = DLIST_node_t_el(&(((type->u).tag_type)->u).ops,1);
      for (decl = (decl_t)DLIST_node_t_head(&(pnVar6->u).ops); decl != (decl_t)0x0;
          decl = (decl_t)DLIST_node_t_next((node_t_conflict)decl)) {
        if (*(int *)decl == 0x6c) {
          lVar2 = *(long *)&decl->width;
          pnVar6 = DLIST_node_t_el((DLIST_node_t *)&decl->param_args_start,3);
          get_type_alias_name(c2m_ctx,*(type **)(lVar2 + 0x40),name);
          if ((pnVar6->code != N_IGNORE) && (pbVar3 = (byte *)pnVar6->attr, (*pbVar3 & 1) != 0)) {
            VARR_charpush(name,'w');
            push_val(name,*(mir_long *)(pbVar3 + 0x30));
            p = *(node_t_conflict *)(pbVar3 + 0x30);
            do {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = p;
              VARR_charpush(name,SUB161(auVar4 % ZEXT816(10),0) + '0');
              p = (node_t_conflict)((ulong)p / 10);
            } while (p != (node_t_conflict)0x0);
          }
        }
      }
    }
    VARR_charpush(name,'e');
    break;
  case TM_ARR:
    VARR_charpush(name,'A');
    get_type_alias_name(c2m_ctx,((type->u).ptr_type)->arr_type,name);
    break;
  case TM_FUNC:
    VARR_charpush(name,'F');
    get_type_alias_name(c2m_ctx,((type->u).ptr_type)->arr_type,name);
    for (ds = (decl_spec *)DLIST_node_t_head(&(((((type->u).tag_type)->op_link).prev)->u).ops);
        ds != (decl_spec *)0x0; ds = (decl_spec *)DLIST_node_t_next((node_t_conflict)ds)) {
      pdVar7 = get_param_decl_spec((node_t_conflict)ds);
      get_type_alias_name(c2m_ctx,pdVar7->type,name);
    }
    cVar5 = 'e';
    if ((((type->u).tag_type)->code & N_I) != N_IGNORE) {
      cVar5 = 'E';
    }
    VARR_charpush(name,cVar5);
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x28a7,"void get_type_alias_name(c2m_ctx_t, struct type *, VARR_char *)");
  }
  return;
}

Assistant:

static void get_type_alias_name (c2m_ctx_t c2m_ctx, struct type *type, VARR (char) * name) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  enum basic_type basic_type;
  size_t i;

  switch (type->mode) {
  case TM_ENUM: basic_type = get_enum_basic_type (type); goto basic;
  case TM_BASIC:
    basic_type = type->u.basic_type;
  basic:
    switch (basic_type) {
    case TP_VOID: VARR_PUSH (char, name, 'v'); break;
    case TP_BOOL: VARR_PUSH (char, name, 'b'); break;
    case TP_CHAR:
    case TP_SCHAR:
    case TP_UCHAR: VARR_PUSH (char, name, 'c'); break;
    case TP_SHORT:
    case TP_USHORT: VARR_PUSH (char, name, 's'); break;
    case TP_INT:
    case TP_UINT: VARR_PUSH (char, name, 'i'); break;
    case TP_LONG:
    case TP_ULONG: VARR_PUSH (char, name, 'l'); break;
    case TP_LLONG:
    case TP_ULLONG: VARR_PUSH (char, name, 'L'); break;
    case TP_FLOAT: VARR_PUSH (char, name, 'f'); break;
    case TP_DOUBLE: VARR_PUSH (char, name, 'd'); break;
    case TP_LDOUBLE: VARR_PUSH (char, name, 'D'); break;
    default: assert (FALSE);
    }
    break;
  case TM_PTR:
    VARR_PUSH (char, name, 'p');
    get_type_alias_name (c2m_ctx, type->u.ptr_type, name);
    break;
  case TM_STRUCT:
  case TM_UNION:
    VARR_PUSH (char, name, type->mode == TM_STRUCT ? 'S' : 'U');
    for (i = 0; i < VARR_LENGTH (node_t, node_stack); i++)
      if (VARR_GET (node_t, node_stack, i) == type->u.tag_type) break;
    if (i < VARR_LENGTH (node_t, node_stack)) {
      VARR_PUSH (char, name, 'r');
      push_val (name, (mir_long) i);
    } else {
      VARR_PUSH (node_t, node_stack, type->u.tag_type);
      for (node_t member = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); member != NULL;
           member = NL_NEXT (member))
        if (member->code == N_MEMBER) {
          decl_t decl = member->attr;
          node_t width = NL_EL (member->u.ops, 3);
          struct expr *expr;

          get_type_alias_name (c2m_ctx, decl->decl_spec.type, name);
          if (width->code != N_IGNORE && (expr = width->attr)->const_p) {
            VARR_PUSH (char, name, 'w');
            push_val (name, (mir_long) expr->c.u_val);
            for (mir_ullong v = expr->c.u_val;;) {
              VARR_PUSH (char, name, v % 10 + '0');
              v /= 10;
              if (v == 0) break;
            }
          }
        }
    }
    VARR_PUSH (char, name, 'e');
    break;
  case TM_ARR:
    VARR_PUSH (char, name, 'A');
    get_type_alias_name (c2m_ctx, type->u.arr_type->el_type, name);
    break;
  case TM_FUNC:
    VARR_PUSH (char, name, 'F');
    get_type_alias_name (c2m_ctx, type->u.func_type->ret_type, name);
    for (node_t p = NL_HEAD (type->u.func_type->param_list->u.ops); p != NULL; p = NL_NEXT (p)) {
      struct decl_spec *ds = get_param_decl_spec (p);
      get_type_alias_name (c2m_ctx, ds->type, name);
    }
    VARR_PUSH (char, name, type->u.func_type->dots_p ? 'E' : 'e');
    break;
  default: assert (FALSE);
  }
}